

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

bool TypeBuilderBuildAndDispose
               (TypeBuilderRef builder,BinaryenHeapType *heapTypes,BinaryenIndex *errorIndex,
               TypeBuilderErrorReason *errorReason)

{
  byte bVar1;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  long lVar2;
  long lVar3;
  ulong uVar4;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_68;
  byte local_50;
  undefined1 local_48 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  
  wasm::TypeBuilder::build((BuildResult *)&local_68._M_first,builder);
  bVar1 = local_50;
  if (local_50 == 1) {
    if (errorIndex != (BinaryenIndex *)0x0) {
      *errorIndex = local_68._0_4_;
    }
    if (errorReason != (TypeBuilderErrorReason *)0x0) {
      *errorReason = local_68._8_4_;
    }
    wasm::TypeBuilder::~TypeBuilder(builder);
    uVar4 = 8;
    local_48 = (undefined1  [8])builder;
  }
  else {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&local_68._M_first);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_48,__x);
    if ((long)types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start - (long)local_48 != 0) {
      lVar2 = (long)types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)local_48 >> 3;
      lVar3 = 0;
      do {
        heapTypes[lVar3] =
             (BinaryenHeapType)
             (((unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> *
               )&((pointer)((long)local_48 + lVar3 * 8))->id)->_M_t).
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
        lVar3 = lVar3 + 1;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
    }
    wasm::TypeBuilder::~TypeBuilder(builder);
    operator_delete(builder,8);
    if (local_48 == (undefined1  [8])0x0) goto LAB_00cfda38;
    uVar4 = (long)types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)local_48;
  }
  operator_delete((void *)local_48,uVar4);
LAB_00cfda38:
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_50]._M_data)
            ((anon_class_1_0_00000001 *)local_48,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&local_68._M_first);
  return bVar1 != 1;
}

Assistant:

bool TypeBuilderBuildAndDispose(TypeBuilderRef builder,
                                BinaryenHeapType* heapTypes,
                                BinaryenIndex* errorIndex,
                                TypeBuilderErrorReason* errorReason) {
  auto* B = (TypeBuilder*)builder;
  auto result = B->build();
  if (auto err = result.getError()) {
    if (errorIndex) {
      *errorIndex = err->index;
    }
    if (errorReason) {
      *errorReason = static_cast<TypeBuilderErrorReason>(err->reason);
    }
    delete B;
    return false;
  }
  auto types = *result;
  for (size_t cur = 0; cur < types.size(); ++cur) {
    heapTypes[cur] = types[cur].getID();
  }
  delete B;
  return true;
}